

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_wakeup(Curl_multi *multi)

{
  ssize_t sVar1;
  int *piVar2;
  int return_success;
  int err;
  char buf [1];
  Curl_multi *multi_local;
  
  if ((multi == (Curl_multi *)0x0) || (multi->magic != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if (multi->wakeup_pair[1] == -1) {
    multi_local._4_4_ = CURLM_WAKEUP_FAILURE;
  }
  else {
    return_success._3_1_ = 1;
    _err = multi;
    do {
      sVar1 = send(_err->wakeup_pair[1],(void *)((long)&return_success + 3),1,0x4000);
      if (-1 < sVar1) goto LAB_0091b5be;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    if (*piVar2 == 0xb) {
LAB_0091b5be:
      multi_local._4_4_ = CURLM_OK;
    }
    else {
      multi_local._4_4_ = CURLM_WAKEUP_FAILURE;
    }
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_wakeup(struct Curl_multi *multi)
{
  /* this function is usually called from another thread,
     it has to be careful only to access parts of the
     Curl_multi struct that are constant */

  /* GOOD_MULTI_HANDLE can be safely called */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

#ifdef ENABLE_WAKEUP
#ifdef USE_WINSOCK
  if(WSASetEvent(multi->wsa_event))
    return CURLM_OK;
#else
  /* the wakeup_pair variable is only written during init and cleanup,
     making it safe to access from another thread after the init part
     and before cleanup */
  if(multi->wakeup_pair[1] != CURL_SOCKET_BAD) {
    char buf[1];
    buf[0] = 1;
    while(1) {
      /* swrite() is not thread-safe in general, because concurrent calls
         can have their messages interleaved, but in this case the content
         of the messages does not matter, which makes it ok to call.

         The write socket is set to non-blocking, this way this function
         cannot block, making it safe to call even from the same thread
         that will call curl_multi_wait(). If swrite() returns that it
         would block, it's considered successful because it means that
         previous calls to this function will wake up the poll(). */
      if(wakeup_write(multi->wakeup_pair[1], buf, sizeof(buf)) < 0) {
        int err = SOCKERRNO;
        int return_success;
#ifdef USE_WINSOCK
        return_success = WSAEWOULDBLOCK == err;
#else
        if(EINTR == err)
          continue;
        return_success = EWOULDBLOCK == err || EAGAIN == err;
#endif
        if(!return_success)
          return CURLM_WAKEUP_FAILURE;
      }
      return CURLM_OK;
    }
  }
#endif
#endif
  return CURLM_WAKEUP_FAILURE;
}